

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

char * __thiscall xray_re::xr_ini_file::r_string(xr_ini_file *this,char *sname,char *lname)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_50;
  ini_item_pred local_48;
  __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_40;
  __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_38;
  __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_30;
  ini_item_vec_cit it;
  ini_section *section;
  char *lname_local;
  char *sname_local;
  xr_ini_file *this_local;
  
  it._M_current = (ini_item **)r_section(this,sname);
  local_38._M_current = (ini_item **)ini_section::begin((ini_section *)it._M_current);
  local_40._M_current = (ini_item **)ini_section::end(it._M_current);
  ini_item_pred::ini_item_pred(&local_48,lname);
  local_30 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_item*const*,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>,xray_re::xr_ini_file::ini_item_pred>
                       (local_38,local_40,local_48);
  local_50._M_current = (ini_item **)ini_section::end(it._M_current);
  bVar1 = __gnu_cxx::operator==(&local_30,&local_50);
  bVar4 = true;
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
    ::operator*(&local_30);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = xr_stricmp(pcVar3,lname);
    bVar4 = iVar2 != 0;
  }
  if (!bVar4) {
    __gnu_cxx::
    __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
    ::operator*(&local_30);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    return pcVar3;
  }
  msg("can\'t find item %s in section %s",lname,sname);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                ,0x62,"const char *xray_re::xr_ini_file::r_string(const char *, const char *) const"
               );
}

Assistant:

const char* xr_ini_file::r_string(const char* sname, const char* lname) const
{
	const ini_section* section = r_section(sname);
	ini_item_vec_cit it = lower_bound_if(section->begin(), section->end(), ini_item_pred(lname));
	if (it == section->end() || xr_stricmp((*it)->name.c_str(), lname) != 0) {
		msg("can't find item %s in section %s", lname, sname);
		xr_not_expected();
	}
	return (*it)->value.c_str();
}